

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

NumberPragmaExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::NumberPragmaExpressionSyntax,slang::syntax::NumberPragmaExpressionSyntax_const&>
          (BumpAllocator *this,NumberPragmaExpressionSyntax *args)

{
  undefined4 uVar1;
  NumberPragmaExpressionSyntax *pNVar2;
  long lVar3;
  NumberPragmaExpressionSyntax *pNVar4;
  byte bVar5;
  
  bVar5 = 0;
  pNVar2 = (NumberPragmaExpressionSyntax *)allocate(this,0x48,8);
  pNVar4 = pNVar2;
  for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4;
    (pNVar4->super_PragmaExpressionSyntax).super_SyntaxNode.kind =
         (args->super_PragmaExpressionSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pNVar4->super_PragmaExpressionSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (NumberPragmaExpressionSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pNVar4 = (NumberPragmaExpressionSyntax *)((long)pNVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pNVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }